

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_setHighsOptionValue(void *highs,char *option,char *value)

{
  HighsInt HVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Highs_setHighsOptionValue",&local_59);
  std::__cxx11::string::string((string *)&local_58,"Highs_setOptionValue",&local_5a);
  Highs::deprecationMessage((Highs *)highs,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  HVar1 = Highs_setOptionValue(highs,option,value);
  return HVar1;
}

Assistant:

HighsInt Highs_setHighsOptionValue(void* highs, const char* option,
                                   const char* value) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_setHighsOptionValue", "Highs_setOptionValue");
  return Highs_setOptionValue(highs, option, value);
}